

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

UriType * __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::CreateSchema(GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               *this,SchemaType **schema,PointerType *pointer,ValueType *v,ValueType *document,
              UriType *id)

{
  SchemaType *pSVar1;
  bool bVar2;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_00;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *rhs;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_68;
  
  if (pointer->parseErrorCode_ != kPointerParseErrorNone) {
    __assert_fail("pointer.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/schema.h"
                  ,0x881,
                  "const UriType &rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>::CreateSchema(const SchemaType **, const PointerType &, const ValueType &, const ValueType &, const UriType &) [ValueT = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  local_68.stack_.stack_ = (char *)0x0;
  local_68.stack_.stackTop_ = (char *)0x0;
  local_68.stack_.allocator_ = (CrtAllocator *)0x0;
  local_68.stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_68.stack_.stackEnd_ = (char *)0x0;
  local_68.stack_.initialCapacity_ = 0x100;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
  ::Stringify<true,rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
            ((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
              *)pointer,&local_68);
  if ((v->data_).f.flags == 3) {
    for (rhs = (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                *)(this->schemaMap_).stack_;
        rhs != (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                *)(this->schemaMap_).stackTop_;
        rhs = (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               *)&rhs[1].nameBuffer_) {
      bVar2 = GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              ::operator==(pointer,rhs);
      if (bVar2) {
        pSVar1 = (SchemaType *)rhs[1].allocator_;
        if (pSVar1 != (SchemaType *)0x0) {
          if (schema != (SchemaType **)0x0) {
            *schema = pSVar1;
          }
          AddSchemaRefs(this,pSVar1);
          goto LAB_00120160;
        }
        break;
      }
    }
    bVar2 = HandleRefSchema(this,pointer,schema,v,document,id);
    if (!bVar2) {
      this_00 = (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                 *)malloc(0x1a8);
      internal::
      Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
      ::Schema(this_00,this,pointer,v,document,this->allocator_,id);
      if (schema != (SchemaType **)0x0) {
        *schema = this_00;
      }
      id = &this_00->id_;
    }
  }
  else {
    pSVar1 = this->typeless_;
    if (schema != (SchemaType **)0x0) {
      *schema = pSVar1;
    }
    AddSchemaRefs(this,pSVar1);
  }
LAB_00120160:
  free(local_68.stack_.stack_);
  operator_delete(local_68.stack_.ownAllocator_,1);
  return id;
}

Assistant:

Hasher(Allocator* allocator = 0, size_t stackCapacity = kDefaultSize) : stack_(allocator, stackCapacity) {}